

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void laguerre_ss_recur(double *p2,double *dp2,double *p1,double x,int order,double *b,double *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double dVar5;
  
  *p1 = 1.0;
  *p2 = x + -1.0;
  *dp2 = 1.0;
  dVar5 = 0.0;
  for (lVar4 = 1; lVar4 < order; lVar4 = lVar4 + 1) {
    dVar1 = *p1;
    dVar2 = *p2;
    *p1 = dVar2;
    dVar3 = *dp2;
    *p2 = (x - b[lVar4]) * dVar2 - dVar1 * c[lVar4];
    *dp2 = ((x - b[lVar4]) * dVar3 + *p1) - dVar5 * c[lVar4];
    dVar5 = dVar3;
  }
  return;
}

Assistant:

void laguerre_ss_recur ( double *p2, double *dp2, double *p1, double x, 
  int order, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_SS_RECUR evaluates a Laguerre polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 February 2008
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Output, double *P2, the value of L(ORDER)(X).
//
//    Output, double *DP2, the value of L'(ORDER)(X).
//
//    Output, double *P1, the value of L(ORDER-1)(X).
//
//    Input, double X, the point at which polynomials are evaluated.
//
//    Input, int ORDER, the order of the polynomial.
//
//    Input, double B[ORDER], C[ORDER], the recursion coefficients.
//
{
  double dp0;
  double dp1;
  int i;
  double p0;

  *p1 = 1.0;
  dp1 = 0.0;

  *p2 = x - 1.0;
  *dp2 = 1.0;

  for ( i = 1; i < order; i++ )
  {
    p0 = *p1;
    dp0 = dp1;

    *p1 = *p2;
    dp1 = *dp2;

    *p2  = ( x - b[i] ) * ( *p1 ) - c[i] * p0;
    *dp2 = ( x - b[i] ) * dp1 + ( *p1 ) - c[i] * dp0;
  }

  return;
}